

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib591.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  CURLM *pCVar2;
  int iVar3;
  FILE *__stream;
  int *piVar4;
  char *pcVar5;
  undefined8 uVar6;
  long lVar7;
  timeval tVar8;
  timeval older;
  timeval older_00;
  int local_344;
  int ec_11;
  int itimeout;
  CURLMcode ec_10;
  CURLMcode ec_9;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_214;
  CURLMcode ec_8;
  int maxfd;
  long timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval interval;
  CURLMcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  __suseconds_t local_50;
  FILE *upload;
  CURLMsg *msg;
  int local_30;
  int msgs_left;
  int running;
  int res;
  CURLM *multi;
  CURL *easy;
  char *URL_local;
  
  multi = (CURLM *)0x0;
  _running = 0;
  msgs_left = 0;
  easy = (CURL *)URL;
  tVar8 = tutil_tvnow();
  _ec_1 = tVar8.tv_sec;
  tv_test_start.tv_sec = _ec_1;
  local_50 = tVar8.tv_usec;
  tv_test_start.tv_usec = local_50;
  __stream = fopen64(libtest_arg3,"rb");
  uVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    curl_mfprintf(uVar1,"fopen() failed with error: %d (%s)\n",iVar3,pcVar5);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg3);
    URL_local._4_4_ = 0x75;
  }
  else {
    iVar3 = curl_global_init(3);
    uVar1 = _stderr;
    if (iVar3 != 0) {
      uVar6 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                    ,0x38,iVar3,uVar6);
      msgs_left = iVar3;
    }
    if (msgs_left == 0) {
      multi = (CURLM *)curl_easy_init();
      if (multi == (CURLM *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                      ,0x3e);
        msgs_left = 0x7c;
      }
      if (msgs_left == 0) {
        iVar3 = curl_easy_setopt(multi,0x29,1);
        uVar1 = _stderr;
        if (iVar3 != 0) {
          uVar6 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                        ,0x41,iVar3,uVar6);
          msgs_left = iVar3;
        }
        if (msgs_left == 0) {
          iVar3 = curl_easy_setopt(multi,0x2712,easy);
          uVar1 = _stderr;
          if (iVar3 != 0) {
            uVar6 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                          ,0x44,iVar3,uVar6);
            msgs_left = iVar3;
          }
          if (msgs_left == 0) {
            iVar3 = curl_easy_setopt(multi,0x2e,1);
            uVar1 = _stderr;
            if (iVar3 != 0) {
              uVar6 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                            ,0x47,iVar3,uVar6);
              msgs_left = iVar3;
            }
            if (msgs_left == 0) {
              iVar3 = curl_easy_setopt(multi,0x2719,__stream);
              uVar1 = _stderr;
              if (iVar3 != 0) {
                uVar6 = curl_easy_strerror(iVar3);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                              ,0x4a,iVar3,uVar6);
                msgs_left = iVar3;
              }
              if (msgs_left == 0) {
                iVar3 = curl_easy_setopt(multi,0x2721,"-");
                uVar1 = _stderr;
                if (iVar3 != 0) {
                  uVar6 = curl_easy_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                ,0x4d,iVar3,uVar6);
                  msgs_left = iVar3;
                }
                pCVar2 = multi;
                if (msgs_left == 0) {
                  lVar7 = strtol(libtest_arg2,(char **)0x0,10);
                  iVar3 = curl_easy_setopt(pCVar2,0xd4,lVar7 * 1000);
                  uVar1 = _stderr;
                  if (iVar3 != 0) {
                    uVar6 = curl_easy_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                  ,0x51,iVar3,uVar6);
                    msgs_left = iVar3;
                  }
                  if (msgs_left == 0) {
                    _running = curl_multi_init();
                    if (_running == 0) {
                      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                    ,0x53);
                      msgs_left = 0x7b;
                    }
                    if (msgs_left == 0) {
                      iVar3 = curl_multi_add_handle(_running,multi);
                      uVar1 = _stderr;
                      if (iVar3 != 0) {
                        uVar6 = curl_multi_strerror(iVar3);
                        curl_mfprintf(uVar1,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                      ,0x55,iVar3,uVar6);
                        msgs_left = iVar3;
                      }
                      while (msgs_left == 0) {
                        _ec_8 = -99;
                        local_214 = -99;
                        iVar3 = curl_multi_perform(_running,&local_30);
                        uVar1 = _stderr;
                        if (iVar3 == 0) {
                          if (local_30 < 0) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                          ,0x5f,local_30);
                            msgs_left = 0x7a;
                          }
                        }
                        else {
                          uVar6 = curl_multi_strerror(iVar3);
                          curl_mfprintf(uVar1,
                                        "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                        ,0x5f,iVar3,uVar6);
                          msgs_left = iVar3;
                        }
                        if (msgs_left != 0) break;
                        tVar8 = tutil_tvnow();
                        older.tv_usec = tv_test_start.tv_usec;
                        older.tv_sec = tv_test_start.tv_sec;
                        lVar7 = tutil_tvdiff(tVar8,older);
                        if (60000 < lVar7) {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                        ,0x61);
                          msgs_left = 0x7d;
                        }
                        if (msgs_left != 0) break;
                        if (local_30 == 0) {
                          lVar7 = curl_multi_info_read(_running,(long)&msg + 4);
                          if (lVar7 != 0) {
                            msgs_left = *(int *)(lVar7 + 0x10);
                          }
                          break;
                        }
                        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
                          fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
                        }
                        for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10;
                            __arr_1._4_4_ = __arr_1._4_4_ + 1) {
                          fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
                        }
                        for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10;
                            __arr_2._4_4_ = __arr_2._4_4_ + 1) {
                          fdexcep.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
                        }
                        iVar3 = curl_multi_fdset(_running,fdwrite.__fds_bits + 0xf,
                                                 fdexcep.__fds_bits + 0xf,&timeout,&local_214);
                        uVar1 = _stderr;
                        if (iVar3 == 0) {
                          if (local_214 < -1) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                          ,0x6a,local_214);
                            msgs_left = 0x7a;
                          }
                        }
                        else {
                          uVar6 = curl_multi_strerror(iVar3);
                          curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                        ,0x6a,iVar3,uVar6);
                          msgs_left = iVar3;
                        }
                        if (msgs_left != 0) break;
                        iVar3 = curl_multi_timeout(_running,&ec_8);
                        uVar1 = _stderr;
                        if (iVar3 == 0) {
                          if (_ec_8 < -1) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                          ,0x6e,_ec_8);
                            msgs_left = 0x73;
                          }
                        }
                        else {
                          uVar6 = curl_multi_strerror(iVar3);
                          curl_mfprintf(uVar1,
                                        "%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                        ,0x6e,iVar3,uVar6);
                          msgs_left = iVar3;
                        }
                        if (msgs_left != 0) break;
                        if (_ec_8 == -1) {
                          fdread.__fds_bits[0xf] = 0;
                        }
                        else {
                          if (_ec_8 < 0x80000000) {
                            local_344 = (int)_ec_8;
                          }
                          else {
                            local_344 = 0x7fffffff;
                          }
                          fdread.__fds_bits[0xf] = (__fd_mask)(local_344 / 1000);
                        }
                        iVar3 = select_wrapper(local_214 + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                                               (fd_set *)(fdexcep.__fds_bits + 0xf),
                                               (fd_set *)&timeout,
                                               (timeval *)(fdread.__fds_bits + 0xf));
                        if (iVar3 == -1) {
                          piVar4 = __errno_location();
                          uVar1 = _stderr;
                          iVar3 = *piVar4;
                          pcVar5 = strerror(iVar3);
                          curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                        ,0x7c,iVar3,pcVar5);
                          msgs_left = 0x79;
                        }
                        if (msgs_left != 0) break;
                        tVar8 = tutil_tvnow();
                        older_00.tv_usec = tv_test_start.tv_usec;
                        older_00.tv_sec = tv_test_start.tv_sec;
                        lVar7 = tutil_tvdiff(tVar8,older_00);
                        if (60000 < lVar7) {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                        ,0x7e);
                          msgs_left = 0x7d;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      curl_multi_cleanup(_running);
      curl_easy_cleanup(multi);
      curl_global_cleanup();
      fclose(__stream);
      URL_local._4_4_ = msgs_left;
    }
    else {
      fclose(__stream);
      URL_local._4_4_ = msgs_left;
    }
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  CURLMsg *msg;
  FILE *upload = NULL;

  start_test_timing();

  upload = fopen(libtest_arg3, "rb");
  if(!upload) {
    fprintf(stderr, "fopen() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg3);
    return TEST_ERR_FOPEN;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(upload);
    return res;
  }

  easy_init(easy);

  /* go verbose */
  easy_setopt(easy, CURLOPT_VERBOSE, 1L);

  /* specify target */
  easy_setopt(easy, CURLOPT_URL, URL);

  /* enable uploading */
  easy_setopt(easy, CURLOPT_UPLOAD, 1L);

  /* data pointer for the file read function */
  easy_setopt(easy, CURLOPT_READDATA, upload);

  /* use active mode FTP */
  easy_setopt(easy, CURLOPT_FTPPORT, "-");

  /* server connection timeout */
  easy_setopt(easy, CURLOPT_ACCEPTTIMEOUT_MS,
              strtol(libtest_arg2, NULL, 10)*1000);

  multi_init(multi);

  multi_add_handle(multi, easy);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = 0;
      interval.tv_usec = 100000L; /* 100 ms */
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &msgs_left);
  if(msg)
    res = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  /* close the local file */
  fclose(upload);

  return res;
}